

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge_p2_dbl.c
# Opt level: O0

void crypto_sign_ed25519_ref10_ge_p2_dbl(ge_p1p1 *r,ge_p2 *p)

{
  int32_t *in_RSI;
  int32_t *in_RDI;
  fe t0;
  int32_t *in_stack_000001f8;
  int32_t *in_stack_00000200;
  int32_t aiStack_38 [10];
  int32_t *local_10;
  int32_t *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000200,in_stack_000001f8);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000200,in_stack_000001f8);
  crypto_sign_ed25519_ref10_fe_sq2(in_stack_00000200,in_stack_000001f8);
  crypto_sign_ed25519_ref10_fe_add(local_8 + 10,local_10,local_10 + 10);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000200,in_stack_000001f8);
  crypto_sign_ed25519_ref10_fe_add(local_8 + 10,local_8 + 0x14,local_8);
  crypto_sign_ed25519_ref10_fe_sub(local_8 + 0x14,local_8 + 0x14,local_8);
  crypto_sign_ed25519_ref10_fe_sub(local_8,aiStack_38,local_8 + 10);
  crypto_sign_ed25519_ref10_fe_sub(local_8 + 0x1e,local_8 + 0x1e,local_8 + 0x14);
  return;
}

Assistant:

void ge_p2_dbl(ge_p1p1 *r,const ge_p2 *p)
{
  fe t0;
#include "ge_p2_dbl.h"
}